

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBoxPrivate::updateEditFieldGeometry(QAbstractSpinBoxPrivate *this)

{
  QAbstractSpinBox *pQVar1;
  QStyle *pQVar2;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [12];
  QAbstractSpinBox *q;
  QStyleOptionSpinBox opt;
  undefined4 in_stack_ffffffffffffff48;
  SubControl in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)0x68ab1c);
  (**(code **)(*(long *)&pQVar1->super_QWidget + 0x1c0))(pQVar1,&local_68);
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)in_RDI,in_stack_ffffffffffffff4c)
  ;
  local_28 = (undefined1 *)CONCAT44(local_28._4_4_,local_6c);
  pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  auVar3 = (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,0,&local_68,8,pQVar1);
  QWidget::setGeometry(auVar3._4_8_,(QRect *)CONCAT44(auVar3._0_4_,in_stack_ffffffffffffff80));
  QStyleOptionSpinBox::~QStyleOptionSpinBox((QStyleOptionSpinBox *)0x68abad);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::updateEditFieldGeometry()
{
    Q_Q(QAbstractSpinBox);
    QStyleOptionSpinBox opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_SpinBoxEditField;
    edit->setGeometry(q->style()->subControlRect(QStyle::CC_SpinBox, &opt,
                                                 QStyle::SC_SpinBoxEditField, q));
}